

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
dlib::resizable_tensor::set_size
          (resizable_tensor *this,longlong n_,longlong k_,longlong nr_,longlong nc_)

{
  size_t new_size;
  
  (this->super_tensor).m_n = n_;
  (this->super_tensor).m_k = k_;
  (this->super_tensor).m_nr = nr_;
  (this->super_tensor).m_nc = nc_;
  new_size = nr_ * nc_ * k_ * n_;
  (this->super_tensor).m_size = new_size;
  if ((long)(this->data_instance).data_size < (long)new_size) {
    gpu_data::set_size(&this->data_instance,new_size);
    return;
  }
  return;
}

Assistant:

void set_size(
            long long n_, long long k_ = 1, long long nr_ = 1, long long nc_ = 1
        )
        {
            DLIB_ASSERT( n_ >= 0 && k_ >= 0 && nr_ >= 0 && nc_ >= 0);

            m_n = n_;
            m_k = k_;
            m_nr = nr_;
            m_nc = nc_;
            m_size = n_*k_*nr_*nc_;
            if ((long long)data_instance.size() < m_size)
                data_instance.set_size(m_size);
#ifdef DLIB_USE_CUDA
            cudnn_descriptor.set_size(m_n,m_k,m_nr,m_nc);
#endif
        }